

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QModelIndex * __thiscall QVariant::toModelIndex(QVariant *this)

{
  QModelIndex *in_RDI;
  QVariant *unaff_retaddr;
  
  qvariant_cast<QModelIndex>(unaff_retaddr);
  return in_RDI;
}

Assistant:

QModelIndex QVariant::toModelIndex() const
{
    return qvariant_cast<QModelIndex>(*this);
}